

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O2

wchar_t borg_attack_aux_launch(void)

{
  int iVar1;
  borg_item_conflict *pbVar2;
  _Bool _Var3;
  wchar_t wVar4;
  char *what;
  ushort uVar5;
  wchar_t wVar6;
  long lVar7;
  wchar_t wVar8;
  ulong uVar9;
  ulong uVar10;
  wchar_t local_38;
  int local_34;
  
  pbVar2 = borg_items;
  uVar5 = z_info->pack_size;
  uVar9 = (ulong)uVar5;
  wVar4 = L'\0';
  wVar6 = L'\0';
  if ((((borg_items[uVar9 + 1].iqty != '\0') && (wVar6 = wVar4, borg.trait[0x70] == 0)) &&
      (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
    uVar10 = uVar9 + 0xc;
    wVar6 = L'\0';
    local_38 = L'\xffffffff';
    local_34 = -1;
    for (lVar7 = uVar9 * 0x388 + 0x2a60;
        (uVar10 < (ulong)z_info->quiver_size + (ulong)uVar5 + 0xc &&
        (borg_items->curses[lVar7 + -0x26] != false)); lVar7 = lVar7 + 0x388) {
      if ((borg.trait[0x98] == (uint)borg_items->curses[lVar7 + -0x2a]) &&
         (iVar1 = *(int *)(borg_items->curses + lVar7 + -6), 0 < iVar1)) {
        wVar8 = borg.trait[0x94] * borg.trait[0x9a] *
                ((int)pbVar2[uVar9 + 1].to_d + (int)*(short *)(borg_items->curses + lVar7 + -0x14) +
                ((borg_items->curses[lVar7 + -0xd] + 1) * (uint)borg_items->curses[lVar7 + -0xe] >>
                1));
        _Var3 = borg_item_note_needs_id((borg_item_conflict *)(borg_items->desc + lVar7));
        wVar4 = wVar8 * 99;
        if (!_Var3) {
          wVar4 = wVar8;
        }
        if (L'\0' < wVar4) {
          wVar4 = borg_launch_bolt(L'\0',wVar4,L'\x01',borg.trait[0x9a] * 2 + L'\x06',
                                   (wchar_t)uVar10);
          if ((wVar4 != wVar6) || (iVar1 < local_34)) {
            if (wVar6 <= wVar4) {
              local_34 = iVar1;
              local_38 = (wchar_t)uVar10;
            }
            if (wVar6 < wVar4) {
              wVar6 = wVar4;
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
      uVar5 = z_info->pack_size;
    }
    if (borg_simulate == false) {
      what = format("# Firing missile \'%s\'",borg_items + local_38);
      borg_note(what);
      borg_keypress(0x66);
      borg_keypress((local_38 - (uint)z_info->pack_size) + 0x24);
      borg_keypress(0x35);
      successful_target = L'\xfffffffe';
    }
  }
  return wVar6;
}

Assistant:

int borg_attack_aux_launch(void)
{
    int n, b_n = 0;

    int k, b_k = -1;
    int d = -1;
    int v, b_v = -1;

    borg_item *bow = &borg_items[INVEN_BOW];

    /* skip if we don't have a bow */
    if (bow->iqty == 0)
        return 0;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Scan the quiver */
    for (k = QUIVER_START; k < QUIVER_END; k++) {

        borg_item *item = &borg_items[k];

        /* Skip empty items */
        if (!item->iqty)
            break;

        /* Skip missiles that don't match the bow */
        if (item->tval != borg.trait[BI_AMMO_TVAL])
            continue;

        /* Skip worthless missiles */
        if (item->value <= 0)
            continue;

        /* Determine average damage */
        d = (item->dd * (item->ds + 1) / 2);
        d = d + item->to_d + bow->to_d;
        d = d * borg.trait[BI_AMMO_POWER] * borg.trait[BI_SHOTS];

        v = item->value;

        /* Boost the perceived damage on unID'd ones so he can get a quick
         * pseudoID on it */
        if (borg_item_note_needs_id(item))
            d = d * 99;

        /* Paranoia */
        if (d <= 0)
            continue;

        /* Choose optimal target of bolt */
        n = borg_launch_bolt(
            0, d, BORG_ATTACK_ARROW, 6 + 2 * borg.trait[BI_AMMO_POWER], k);

        /* if two attacks are equal, pick the cheaper ammo */
        if (n == b_n && v >= b_v)
            continue;

        if (n >= b_n) {
            b_n = n;
            b_v = v;
            b_k = k;
        }
    }

    /* Nothing to use */
    if (b_n < 0)
        return 0;

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Do it */
    borg_note(format("# Firing missile '%s'", borg_items[b_k].desc));

    /* Fire */
    borg_keypress('f');

    /* Use the missile from the quiver */
    borg_keypress(((b_k - QUIVER_START) + '0'));

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -2;

    /* Value */
    return b_n;
}